

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void fractionalScaleHandlePreferredScale
               (void *userData,wp_fractional_scale_v1 *fractionalScale,uint32_t numerator)

{
  *(uint32_t *)((long)userData + 0x428) = numerator;
  _glfwInputWindowContentScale
            ((_GLFWwindow *)userData,(float)numerator / 120.0,(float)numerator / 120.0);
  resizeFramebuffer((_GLFWwindow *)userData);
  if (*(int *)((long)userData + 0x368) != 0) {
    _glfwInputWindowDamage((_GLFWwindow *)userData);
    return;
  }
  return;
}

Assistant:

void fractionalScaleHandlePreferredScale(void* userData,
                                         struct wp_fractional_scale_v1* fractionalScale,
                                         uint32_t numerator)
{
    _GLFWwindow* window = userData;

    window->wl.scalingNumerator = numerator;
    _glfwInputWindowContentScale(window, numerator / 120.f, numerator / 120.f);
    resizeFramebuffer(window);

    if (window->wl.visible)
        _glfwInputWindowDamage(window);
}